

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_by_name.hpp
# Opt level: O1

void __thiscall
duckdb::UnionByReaderTask<duckdb::CSVMultiFileInfo,_duckdb::CSVReaderOptions>::ExecuteTask
          (UnionByReaderTask<duckdb::CSVMultiFileInfo,_duckdb::CSVReaderOptions> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  reference pvVar3;
  shared_ptr<duckdb::BaseFileReader,_true> reader;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  shared_ptr<duckdb::BaseFileReader,_true> local_38;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  CSVMultiFileInfo::CreateReader
            ((CSVMultiFileInfo *)&local_28,this->context,this->file,this->options,this->file_options
            );
  local_38.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  local_38.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_20;
  local_28 = (element_type *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CSVMultiFileInfo::GetUnionData((CSVMultiFileInfo *)&local_48,&local_38,this->file_idx);
  pvVar3 = vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true>::operator[]
                     (this->readers,this->file_idx);
  p_Var2 = p_Stack_40;
  peVar1 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pvVar3->internal).super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (pvVar3->internal).super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (pvVar3->internal).super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if (local_38.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.
               super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void ExecuteTask() override {
		auto reader = OP::CreateReader(context, file, options, file_options);
		readers[file_idx] = OP::GetUnionData(std::move(reader), file_idx);
	}